

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmTarget * __thiscall
cmMakefile::AddLibrary
          (cmMakefile *this,string *lname,TargetType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs,bool excludeFromAll)

{
  cmTarget *this_00;
  pair<cmTarget_&,_bool> pVar1;
  string local_50;
  
  if ((3 < type - STATIC_LIBRARY) && (type != INTERFACE_LIBRARY)) {
    __assert_fail("type == cmStateEnums::STATIC_LIBRARY || type == cmStateEnums::SHARED_LIBRARY || type == cmStateEnums::MODULE_LIBRARY || type == cmStateEnums::OBJECT_LIBRARY || type == cmStateEnums::INTERFACE_LIBRARY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                  ,0x816,
                  "cmTarget *cmMakefile::AddLibrary(const std::string &, cmStateEnums::TargetType, const std::vector<std::string> &, bool)"
                 );
  }
  pVar1 = CreateNewTarget(this,lname,type,Yes);
  this_00 = pVar1.first;
  cmTarget::ClearDependencyInformation(this_00,this);
  if (excludeFromAll) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"EXCLUDE_FROM_ALL","");
    cmTarget::SetProperty(this_00,&local_50,"TRUE");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  cmTarget::AddSources(this_00,srcs);
  AddGlobalLinkInformation(this,this_00);
  return this_00;
}

Assistant:

cmTarget* cmMakefile::AddLibrary(const std::string& lname,
                                 cmStateEnums::TargetType type,
                                 const std::vector<std::string>& srcs,
                                 bool excludeFromAll)
{
  assert(type == cmStateEnums::STATIC_LIBRARY ||
         type == cmStateEnums::SHARED_LIBRARY ||
         type == cmStateEnums::MODULE_LIBRARY ||
         type == cmStateEnums::OBJECT_LIBRARY ||
         type == cmStateEnums::INTERFACE_LIBRARY);

  cmTarget* target = this->AddNewTarget(type, lname);
  // Clear its dependencies. Otherwise, dependencies might persist
  // over changes in CMakeLists.txt, making the information stale and
  // hence useless.
  target->ClearDependencyInformation(*this);
  if (excludeFromAll) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  target->AddSources(srcs);
  this->AddGlobalLinkInformation(*target);
  return target;
}